

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_alpn_to_proto_buf(alpn_proto_buf *buf,alpn_spec *spec)

{
  byte bVar1;
  size_t sVar2;
  bool bVar3;
  int local_34;
  uchar blen;
  int off;
  size_t len;
  size_t i;
  alpn_spec *spec_local;
  alpn_proto_buf *buf_local;
  
  local_34 = 0;
  memset(buf,0,0x28);
  len = 0;
  while( true ) {
    bVar3 = false;
    if (spec != (alpn_spec *)0x0) {
      bVar3 = len < spec->count;
    }
    if (!bVar3) {
      buf->len = local_34;
      return CURLE_OK;
    }
    sVar2 = strlen(spec->entries[len]);
    if (9 < sVar2) {
      return CURLE_FAILED_INIT;
    }
    bVar1 = (byte)sVar2;
    if (0x20 < (int)(local_34 + (uint)bVar1 + 1)) break;
    buf->data[local_34] = bVar1;
    memcpy(buf->data + (local_34 + 1),spec->entries + len,sVar2 & 0xff);
    local_34 = (uint)bVar1 + local_34 + 1;
    len = len + 1;
  }
  return CURLE_FAILED_INIT;
}

Assistant:

CURLcode Curl_alpn_to_proto_buf(struct alpn_proto_buf *buf,
                                const struct alpn_spec *spec)
{
  size_t i, len;
  int off = 0;
  unsigned char blen;

  memset(buf, 0, sizeof(*buf));
  for(i = 0; spec && i < spec->count; ++i) {
    len = strlen(spec->entries[i]);
    if(len >= ALPN_NAME_MAX)
      return CURLE_FAILED_INIT;
    blen = (unsigned  char)len;
    if(off + blen + 1 >= (int)sizeof(buf->data))
      return CURLE_FAILED_INIT;
    buf->data[off++] = blen;
    memcpy(buf->data + off, spec->entries[i], blen);
    off += blen;
  }
  buf->len = off;
  return CURLE_OK;
}